

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O1

bool basic_test_64bit(string *vals,double val)

{
  byte bVar1;
  byte *ptr;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  ostream *poVar8;
  byte *pbVar9;
  ulong uVar10;
  runtime_error *this;
  ulong uVar11;
  byte bVar12;
  long lVar13;
  byte *pbVar14;
  byte bVar15;
  ulong uVar16;
  char *pcVar17;
  uint uVar18;
  byte *pbVar19;
  ulong uVar20;
  byte *pbVar21;
  int iVar22;
  byte *pbVar23;
  bool bVar24;
  double local_40;
  byte *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," parsing ",9);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(vals->_M_dataplus)._M_p,vals->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  ptr = (byte *)(vals->_M_dataplus)._M_p;
  bVar1 = *ptr;
  pbVar9 = ptr;
  if (bVar1 == 0x2d) {
    if ((byte)(ptr[1] - 0x30) < 10) {
      pbVar9 = ptr + 1;
      goto LAB_00106804;
    }
    pbVar21 = (byte *)0x0;
  }
  else {
LAB_00106804:
    if (*pbVar9 == 0x30) {
      uVar20 = 0;
      pbVar21 = (byte *)0x0;
      if (9 < (byte)(pbVar9[1] - 0x30)) {
        pbVar23 = pbVar9 + 1;
LAB_0010686e:
        if (*pbVar23 == 0x2e) {
          if (9 < (byte)(pbVar23[1] - 0x30)) goto LAB_001069c2;
          uVar20 = (ulong)(byte)(pbVar23[1] - 0x30) + uVar20 * 10;
          pbVar21 = pbVar23 + 2;
          bVar12 = pbVar23[2];
          while ((byte)(bVar12 - 0x30) < 10) {
            uVar20 = (ulong)(byte)(bVar12 - 0x30) + uVar20 * 10;
            pbVar19 = pbVar21 + 1;
            pbVar21 = pbVar21 + 1;
            bVar12 = *pbVar19;
          }
          pbVar19 = pbVar23 + (1 - (long)pbVar21);
          pbVar23 = pbVar21;
        }
        else {
          pbVar19 = (byte *)0x0;
        }
        pbVar21 = pbVar23;
        if ((*pbVar23 | 0x20) == 0x65) {
          bVar24 = (pbVar23[1] - 0x2b & 0xfd) == 0;
          pbVar21 = pbVar23 + 1;
          if (bVar24) {
            pbVar21 = pbVar23 + 2;
          }
          bVar12 = pbVar23[(ulong)bVar24 + 1] - 0x30;
          if (bVar12 < 10) {
            bVar15 = pbVar21[1] - 0x30;
            uVar10 = (ulong)bVar15 + (ulong)bVar12 * 10;
            if (9 < bVar15) {
              uVar10 = (ulong)bVar12;
            }
            pbVar14 = pbVar21 + 2;
            if (9 < bVar15) {
              pbVar14 = pbVar21 + 1;
            }
            bVar15 = pbVar21[(ulong)(bVar15 < 10) + 1] - 0x30;
            pbVar21 = pbVar14 + (bVar15 < 10);
            uVar16 = (ulong)bVar15 + uVar10 * 10;
            if (9 < bVar15) {
              uVar16 = uVar10;
            }
            bVar15 = *pbVar21;
            while ((byte)(bVar15 - 0x30) < 10) {
              if ((long)uVar16 < 0x100000000) {
                uVar16 = (ulong)(byte)(bVar15 - 0x30) + uVar16 * 10;
              }
              pbVar14 = pbVar21 + 1;
              pbVar21 = pbVar21 + 1;
              bVar15 = *pbVar14;
            }
            uVar10 = -uVar16;
            if (pbVar23[1] != 0x2d) {
              uVar10 = uVar16;
            }
            pbVar19 = pbVar19 + uVar10;
          }
          if (9 < bVar12) goto LAB_001069c2;
        }
        iVar22 = (int)pbVar23 + ~(uint)pbVar9;
        if (0x12 < iVar22) {
          for (lVar13 = 0; (pbVar9[lVar13] == 0x30 || (pbVar9[lVar13] == 0x2e)); lVar13 = lVar13 + 1
              ) {
          }
          local_38 = pbVar19;
          if (0x12 < iVar22 - (int)lVar13) {
            pbVar21 = (byte *)fast_double_parser::parse_float_strtod((char *)ptr,&local_40);
            goto LAB_00106b5f;
          }
        }
        if (pbVar19 + -0x135 < (byte *)0xfffffffffffffd86) {
LAB_001069f2:
          pbVar21 = (byte *)fast_double_parser::parse_float_strtod((char *)ptr,&local_40);
        }
        else if ((uVar20 >> 0x35 == 0) && (pbVar19 + 0x16 < (byte *)0x2d)) {
          if ((long)pbVar19 < 0) {
            local_40 = (double)(long)uVar20 /
                       *(double *)
                        (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                         power_of_ten + (long)pbVar19 * -8);
          }
          else {
            local_40 = (double)(long)uVar20 *
                       *(double *)
                        (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                         power_of_ten + (long)pbVar19 * 8);
          }
          if (bVar1 == 0x2d) {
            local_40 = -local_40;
          }
        }
        else {
          if (uVar20 != 0) {
            uVar10 = 0x3f;
            if (uVar20 != 0) {
              for (; uVar20 >> uVar10 == 0; uVar10 = uVar10 - 1) {
              }
            }
            uVar20 = uVar20 << ((byte)(uVar10 ^ 0x3f) & 0x3f);
            auVar2._8_8_ = 0;
            auVar2._0_8_ = uVar20;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)(fast_double_parser::
                                      compute_float_64(long,unsigned_long,bool,bool*)::mantissa_64 +
                                     (long)pbVar19 * 8 + 0xa28);
            auVar2 = auVar2 * auVar4;
            if ((((~auVar2._8_4_ & 0x1ff) != 0) || (!CARRY8(auVar2._0_8_,uVar20))) ||
               (auVar3._8_8_ = 0, auVar3._0_8_ = uVar20, auVar5._8_8_ = 0,
               auVar5._0_8_ = *(ulong *)(fast_double_parser::
                                         compute_float_64(long,unsigned_long,bool,bool*)::
                                         mantissa_128 + (long)pbVar19 * 8 + 0xa28), auVar6._8_8_ = 0
               , auVar6._0_8_ = SUB168(auVar3 * auVar5,8), auVar2 = auVar2 + auVar6,
               uVar20 <= ~SUB168(auVar3 * auVar5,0) ||
               ((~auVar2._8_4_ & 0x1ff) != 0 || auVar2._0_8_ != -1))) {
              uVar20 = auVar2._8_8_ >> (9U - (auVar2[0xf] >> 7) & 0x3f);
              uVar18 = (uint)uVar20;
              if (((auVar2 & (undefined1  [16])0x1ff) != (undefined1  [16])0x0 || auVar2._0_8_ != 0)
                 || ((uVar18 & 3) != 1)) {
                uVar20 = (uVar18 & 1) + uVar20;
                uVar16 = uVar20 >> 0x36;
                uVar10 = (((long)pbVar19 * 0x3526a >> 0x10) + 0x43f) -
                         ((auVar2._8_8_ >> 0x3f ^ 1) + (uVar10 ^ 0x3f) + -1 + (ulong)(uVar16 == 0));
                if ((uVar10 != 0) && (uVar10 < 0x7ff)) {
                  uVar11 = 0;
                  if (uVar16 == 0) {
                    uVar11 = uVar20 >> 1 & 0xefffffffffffff;
                  }
                  local_40 = (double)((ulong)(bVar1 == 0x2d) << 0x3f | uVar11 | uVar10 << 0x34);
                  goto LAB_00106b5f;
                }
              }
            }
            local_40 = 0.0;
            goto LAB_001069f2;
          }
          if (bVar1 == 0x2d) {
            local_40 = -0.0;
          }
          else {
            local_40 = 0.0;
          }
        }
      }
    }
    else {
      bVar12 = *pbVar9 - 0x30;
      if (bVar12 < 10) {
        uVar20 = (ulong)bVar12;
        bVar12 = pbVar9[1];
        pbVar21 = pbVar9;
        while( true ) {
          pbVar23 = pbVar21 + 1;
          if (9 < (byte)(bVar12 - 0x30)) break;
          uVar20 = (ulong)(byte)(bVar12 - 0x30) + uVar20 * 10;
          bVar12 = pbVar21[2];
          pbVar21 = pbVar23;
        }
        goto LAB_0010686e;
      }
LAB_001069c2:
      pbVar21 = (byte *)0x0;
    }
  }
LAB_00106b5f:
  dVar7 = local_40;
  if (pbVar21 == (byte *)0x0) {
    pcVar17 = " I could not parse ";
    lVar13 = 0x13;
LAB_00106c5a:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,lVar13);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(vals->_M_dataplus)._M_p,vals->_M_string_length);
LAB_00106c71:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    bVar24 = false;
  }
  else {
    if (pbVar21 != (byte *)((vals->_M_dataplus)._M_p + vals->_M_string_length)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"gap is ",7);
      poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar8);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"does not point at the end.");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (NAN(val)) {
      if (!NAN(local_40)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"not nan",7);
        poVar8 = std::ostream::_M_insert<double>(dVar7);
        goto LAB_00106c71;
      }
    }
    else if ((local_40 != val) || (NAN(local_40) || NAN(val))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"I got ",6);
      *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) =
           *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) | 0x104;
      poVar8 = std::ostream::_M_insert<double>(dVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," but I was expecting ",0x15);
      poVar8 = std::ostream::_M_insert<double>(val);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) =
           *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) & 0xffffffb5 | 2;
      pcVar17 = "string: ";
      lVar13 = 8;
      goto LAB_00106c5a;
    }
    *(uint *)(puts + *(long *)(std::cout + -0x18)) =
         *(uint *)(puts + *(long *)(std::cout + -0x18)) | 0x104;
    poVar8 = std::ostream::_M_insert<double>(local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," == ",4);
    poVar8 = std::ostream::_M_insert<double>(val);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    *(uint *)(puts + *(long *)(std::cout + -0x18)) =
         *(uint *)(puts + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    bVar24 = true;
  }
  return bVar24;
}

Assistant:

bool basic_test_64bit(std::string vals, double val) {
  std::cout << " parsing "  << vals << std::endl;
  double result_value;
  const char * ok = fast_double_parser::parse_number(vals.c_str(), & result_value);
  if (!ok) {
    std::cerr << " I could not parse " << vals << std::endl;
    return false;
  }
  if(ok != vals.c_str() + vals.size()) {
    std::cout << "gap is " << (ok - vals.c_str()) << std::endl;
    throw std::runtime_error("does not point at the end.");

  }   
  if (std::isnan(val)) {
    if (!std::isnan(result_value)) {
      std::cerr << "not nan" << result_value << std::endl;
      return false;
    }
  } else if (result_value != val) {
    std::cerr << "I got " << std::hexfloat << result_value << " but I was expecting " << val
              << std::endl;
    std::cerr << std::dec;
    std::cerr << "string: " << vals << std::endl;
    return false;
  }
  std::cout << std::hexfloat << result_value << " == " << val << std::endl;
  std::cout << std::dec;

  return true;
}